

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseThenFinallyFunction::JavascriptPromiseThenFinallyFunction
          (JavascriptPromiseThenFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          RecyclableObject *OnFinally,RecyclableObject *Constructor,bool shouldThrow)

{
  bool shouldThrow_local;
  RecyclableObject *Constructor_local;
  RecyclableObject *OnFinally_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseThenFinallyFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dd4cc0;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->OnFinally,OnFinally);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->Constructor,Constructor);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThenFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, RecyclableObject* OnFinally, RecyclableObject* Constructor, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), OnFinally(OnFinally), Constructor(Constructor), shouldThrow(shouldThrow)
        { }